

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

void __thiscall
AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
          (AutoTagNativeLibraryEntry *this,RecyclableObject *function,CallInfo callInfo,PCWSTR name,
          void *addr)

{
  ThreadContext *pTVar1;
  
  (this->entry).function = function;
  (this->entry).callInfo = callInfo;
  (this->entry).name = name;
  (this->entry).addr = addr;
  pTVar1 = ((((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr)->threadContext;
  (this->entry).next = (pTVar1->nativeLibraryEntry).head;
  (pTVar1->nativeLibraryEntry).head = &this->entry;
  return;
}

Assistant:

AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry(Js::RecyclableObject* function, Js::CallInfo callInfo, PCWSTR name, void* addr)
{
    // Save function/callInfo values (for StackWalker). Compiler may stackpack/optimize them for built-in native functions.
    entry.function = function;
    entry.callInfo = callInfo;
    entry.name = name;
    entry.addr = addr;

    ThreadContext* threadContext = function->GetScriptContext()->GetThreadContext();
    threadContext->PushNativeLibraryEntry(&entry);
}